

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TeamCityReporter::assertionEnded(TeamCityReporter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  OfType OVar2;
  size_type sVar3;
  AssertionResult *pAVar4;
  ostream *poVar5;
  AssertionResult *in_RSI;
  long in_RDI;
  StringRef in_stack_00000030;
  MessageInfo *messageInfo;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  ReusableStringStream msg;
  AssertionResult *result;
  string *in_stack_fffffffffffffdc8;
  AssertionResult *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffdf0;
  ReusableStringStream *in_stack_fffffffffffffe10;
  ostream *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  string local_1a0 [48];
  string local_170 [48];
  string local_140 [39];
  undefined1 local_119;
  string local_118 [32];
  string local_f8 [39];
  undefined1 local_d1;
  reference local_d0;
  MessageInfo *local_c8;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_c0;
  AssertionResult *local_b8;
  undefined1 local_49;
  SourceLineInfo local_48;
  ReusableStringStream local_28;
  AssertionResult *local_18;
  AssertionResult *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RSI;
  bVar1 = AssertionResult::isOk(in_stack_fffffffffffffdd0);
  if ((!bVar1) || (OVar2 = AssertionResult::getResultType(local_18), OVar2 == ExplicitSkip)) {
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_stack_fffffffffffffdd0);
    if ((*(byte *)(in_RDI + 0x90) & 1) == 0) {
      ReusableStringStream::get(&local_28);
      printSectionHeader((TeamCityReporter *)
                         CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                         in_stack_fffffffffffffe38);
    }
    *(undefined1 *)(in_RDI + 0x90) = 1;
    local_48 = AssertionResult::getSourceInfo(local_18);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdd0,
               (SourceLineInfo *)in_stack_fffffffffffffdc8);
    local_49 = 10;
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    OVar2 = AssertionResult::getResultType(local_18);
    if (OVar2 == Unknown) {
LAB_001ac979:
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_stack_fffffffffffffdd0);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdd0,
                 (char (*) [16])in_stack_fffffffffffffdc8);
      ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffdc8);
      throw_domain_error(in_stack_fffffffffffffdf0);
    }
    if ((uint)OVar2 < 3) {
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_stack_fffffffffffffdd0);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdd0,
                 (char (*) [36])in_stack_fffffffffffffdc8);
      ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffdc8);
      throw_domain_error(in_stack_fffffffffffffdf0);
    }
    if (OVar2 == ExplicitSkip) {
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdd0,
                 (char (*) [14])in_stack_fffffffffffffdc8);
    }
    else {
      if (OVar2 == FailureBit) goto LAB_001ac979;
      if (OVar2 == ExpressionFailed) {
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffdd0,
                   (char (*) [18])in_stack_fffffffffffffdc8);
      }
      else if (OVar2 == ExplicitFailure) {
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffdd0,
                   (char (*) [17])in_stack_fffffffffffffdc8);
      }
      else {
        if (OVar2 == Exception) goto LAB_001ac979;
        if (OVar2 == ThrewException) {
          ReusableStringStream::operator<<
                    ((ReusableStringStream *)in_stack_fffffffffffffdd0,
                     (char (*) [21])in_stack_fffffffffffffdc8);
        }
        else if (OVar2 == DidntThrowException) {
          ReusableStringStream::operator<<
                    ((ReusableStringStream *)in_stack_fffffffffffffdd0,
                     (char (*) [47])in_stack_fffffffffffffdc8);
        }
        else if (OVar2 == FatalErrorCondition) {
          ReusableStringStream::operator<<
                    ((ReusableStringStream *)in_stack_fffffffffffffdd0,
                     (char (*) [22])in_stack_fffffffffffffdc8);
        }
      }
    }
    sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                      ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                       (local_10 + 1));
    if (sVar3 == 1) {
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdd0,
                 (char (*) [15])in_stack_fffffffffffffdc8);
    }
    sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                      ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                       (local_10 + 1));
    if (1 < sVar3) {
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdd0,
                 (char (*) [16])in_stack_fffffffffffffdc8);
    }
    local_b8 = local_10 + 1;
    local_c0._M_current =
         (MessageInfo *)
         std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                   ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                    in_stack_fffffffffffffdc8);
    local_c8 = (MessageInfo *)
               std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                         ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                          in_stack_fffffffffffffdc8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)in_stack_fffffffffffffdd0,
                              (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)in_stack_fffffffffffffdc8), bVar1) {
      local_d0 = __gnu_cxx::
                 __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                 ::operator*(&local_c0);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdd0,
                 (char (*) [5])in_stack_fffffffffffffdc8);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      local_d1 = 0x22;
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8
                );
      __gnu_cxx::
      __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
      ::operator++(&local_c0);
    }
    bVar1 = AssertionResult::hasExpression((AssertionResult *)0x1acb58);
    if (bVar1) {
      pAVar4 = (AssertionResult *)
               ReusableStringStream::operator<<
                         ((ReusableStringStream *)in_stack_fffffffffffffdd0,
                          (char (*) [4])in_stack_fffffffffffffdc8);
      AssertionResult::getExpressionInMacro_abi_cxx11_(pAVar4);
      in_stack_fffffffffffffe10 =
           ReusableStringStream::operator<<
                     ((ReusableStringStream *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      pAVar4 = (AssertionResult *)
               ReusableStringStream::operator<<
                         ((ReusableStringStream *)in_stack_fffffffffffffdd0,
                          (char (*) [20])in_stack_fffffffffffffdc8);
      AssertionResult::getExpandedExpression_abi_cxx11_(pAVar4);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      local_119 = 10;
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8
                );
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_f8);
    }
    OVar2 = AssertionResult::getResultType(local_18);
    if (OVar2 == ExplicitSkip) {
      std::operator<<(*(ostream **)(in_RDI + 0x20),"##teamcity[testIgnored");
    }
    else {
      bVar1 = TestCaseInfo::okToFail((TestCaseInfo *)in_stack_fffffffffffffdd0);
      if (bVar1) {
        ReusableStringStream::operator<<
                  ((ReusableStringStream *)in_stack_fffffffffffffdd0,
                   (char (*) [49])in_stack_fffffffffffffdc8);
        std::operator<<(*(ostream **)(in_RDI + 0x20),"##teamcity[testIgnored");
      }
      else {
        std::operator<<(*(ostream **)(in_RDI + 0x20),"##teamcity[testFailed");
      }
    }
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 0x20)," name=\'");
    StringRef::StringRef((StringRef *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    (anonymous_namespace)::escape_abi_cxx11_(in_stack_00000030);
    poVar5 = std::operator<<(poVar5,local_140);
    poVar5 = std::operator<<(poVar5,'\'');
    poVar5 = std::operator<<(poVar5," message=\'");
    ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffdc8);
    StringRef::StringRef((StringRef *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    (anonymous_namespace)::escape_abi_cxx11_(in_stack_00000030);
    poVar5 = std::operator<<(poVar5,local_170);
    poVar5 = std::operator<<(poVar5,'\'');
    std::operator<<(poVar5,"]\n");
    std::__cxx11::string::~string(local_170);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_140);
    ReusableStringStream::~ReusableStringStream(in_stack_fffffffffffffe10);
  }
  std::ostream::flush();
  return;
}

Assistant:

void TeamCityReporter::assertionEnded(AssertionStats const& assertionStats) {
        AssertionResult const& result = assertionStats.assertionResult;
        if ( !result.isOk() ||
             result.getResultType() == ResultWas::ExplicitSkip ) {

            ReusableStringStream msg;
            if (!m_headerPrintedForThisSection)
                printSectionHeader(msg.get());
            m_headerPrintedForThisSection = true;

            msg << result.getSourceInfo() << '\n';

            switch (result.getResultType()) {
            case ResultWas::ExpressionFailed:
                msg << "expression failed";
                break;
            case ResultWas::ThrewException:
                msg << "unexpected exception";
                break;
            case ResultWas::FatalErrorCondition:
                msg << "fatal error condition";
                break;
            case ResultWas::DidntThrowException:
                msg << "no exception was thrown where one was expected";
                break;
            case ResultWas::ExplicitFailure:
                msg << "explicit failure";
                break;
            case ResultWas::ExplicitSkip:
                msg << "explicit skip";
                break;

                // We shouldn't get here because of the isOk() test
            case ResultWas::Ok:
            case ResultWas::Info:
            case ResultWas::Warning:
                CATCH_ERROR("Internal error in TeamCity reporter");
                // These cases are here to prevent compiler warnings
            case ResultWas::Unknown:
            case ResultWas::FailureBit:
            case ResultWas::Exception:
                CATCH_ERROR("Not implemented");
            }
            if (assertionStats.infoMessages.size() == 1)
                msg << " with message:";
            if (assertionStats.infoMessages.size() > 1)
                msg << " with messages:";
            for (auto const& messageInfo : assertionStats.infoMessages)
                msg << "\n  \"" << messageInfo.message << '"';


            if (result.hasExpression()) {
                msg <<
                    "\n  " << result.getExpressionInMacro() << "\n"
                    "with expansion:\n"
                    "  " << result.getExpandedExpression() << '\n';
            }

            if ( result.getResultType() == ResultWas::ExplicitSkip ) {
                m_stream << "##teamcity[testIgnored";
            } else if ( currentTestCaseInfo->okToFail() ) {
                msg << "- failure ignore as test marked as 'ok to fail'\n";
                m_stream << "##teamcity[testIgnored";
            } else {
                m_stream << "##teamcity[testFailed";
            }
            m_stream << " name='" << escape( currentTestCaseInfo->name ) << '\''
                     << " message='" << escape( msg.str() ) << '\'' << "]\n";
        }
        m_stream.flush();
    }